

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportFileGenerator::GenerateImportPropertyCode
          (cmExportFileGenerator *this,ostream *os,string *config,cmGeneratorTarget *target,
          ImportPropertyMap *properties)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  string targetName;
  string local_70;
  string local_50 [32];
  
  std::__cxx11::string::string(local_50,(string *)&this->Namespace);
  cmGeneratorTarget::GetExportName_abi_cxx11_(&local_70,target);
  std::__cxx11::string::append(local_50);
  std::__cxx11::string::~string((string *)&local_70);
  poVar1 = std::operator<<(os,"# Import target \"");
  poVar1 = std::operator<<(poVar1,local_50);
  poVar1 = std::operator<<(poVar1,"\" for configuration \"");
  poVar1 = std::operator<<(poVar1,(string *)config);
  std::operator<<(poVar1,"\"\n");
  poVar1 = std::operator<<(os,"set_property(TARGET ");
  poVar1 = std::operator<<(poVar1,local_50);
  std::operator<<(poVar1," APPEND PROPERTY IMPORTED_CONFIGURATIONS ");
  if (config->_M_string_length == 0) {
    std::operator<<(os,"NOCONFIG");
  }
  else {
    cmsys::SystemTools::UpperCase(&local_70,config);
    std::operator<<(os,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::operator<<(os,")\n");
  poVar1 = std::operator<<(os,"set_target_properties(");
  poVar1 = std::operator<<(poVar1,local_50);
  std::operator<<(poVar1," PROPERTIES\n");
  for (p_Var2 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(properties->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::operator<<(os,"  ");
    poVar1 = std::operator<<(poVar1,(string *)(p_Var2 + 1));
    poVar1 = std::operator<<(poVar1," ");
    cmExportFileGeneratorEscape(&local_70,(string *)(p_Var2 + 2));
    poVar1 = std::operator<<(poVar1,(string *)&local_70);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string((string *)&local_70);
  }
  poVar1 = std::operator<<(os,"  )\n");
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void cmExportFileGenerator::GenerateImportPropertyCode(
  std::ostream& os, const std::string& config, cmGeneratorTarget const* target,
  ImportPropertyMap const& properties)
{
  // Construct the imported target name.
  std::string targetName = this->Namespace;

  targetName += target->GetExportName();

  // Set the import properties.
  os << "# Import target \"" << targetName << "\" for configuration \""
     << config << "\"\n";
  os << "set_property(TARGET " << targetName
     << " APPEND PROPERTY IMPORTED_CONFIGURATIONS ";
  if (!config.empty()) {
    os << cmSystemTools::UpperCase(config);
  } else {
    os << "NOCONFIG";
  }
  os << ")\n";
  os << "set_target_properties(" << targetName << " PROPERTIES\n";
  for (auto const& property : properties) {
    os << "  " << property.first << " "
       << cmExportFileGeneratorEscape(property.second) << "\n";
  }
  os << "  )\n"
     << "\n";
}